

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

int TestRegRptrEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                       _func_int_uchar_ptr_x86Reg_x86Size_x86Reg_int_x86Reg_int *fun,uint testSize)

{
  x86Reg xVar1;
  x86Reg xVar2;
  x86Reg xVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  x86Reg *pxVar8;
  uchar *puVar9;
  long local_58;
  int local_40;
  
  local_58 = 0;
  puVar9 = stream;
  do {
    lVar7 = 0;
    do {
      pxVar8 = testBaseRegs;
      lVar6 = 0;
      do {
        if (((int)lVar6 != 0 || (int)lVar7 != 0) && (testSize & 1) != 0) {
          xVar1 = testRegs[local_58];
          xVar2 = testIndexRegs[lVar7];
          xVar3 = *pxVar8;
          EMIT_OP_REG_RPTR(ctx,op,xVar1,sDWORD,xVar2,1,xVar3,0);
          iVar4 = (*fun)(puVar9,xVar1,sDWORD,xVar2,1,xVar3,0);
          puVar9 = puVar9 + iVar4;
          EMIT_OP_REG_RPTR(ctx,op,xVar1,sDWORD,xVar2,1,xVar3,4);
          iVar4 = (*fun)(puVar9,xVar1,sDWORD,xVar2,1,xVar3,4);
          EMIT_OP_REG_RPTR(ctx,op,xVar1,sDWORD,xVar2,1,xVar3,0x400);
          iVar5 = (*fun)(puVar9 + iVar4,xVar1,sDWORD,xVar2,1,xVar3,0x400);
          puVar9 = puVar9 + iVar4 + iVar5;
          if (lVar7 != 0) {
            EMIT_OP_REG_RPTR(ctx,op,xVar1,sDWORD,xVar2,2,xVar3,0);
            iVar4 = (*fun)(puVar9,xVar1,sDWORD,xVar2,2,xVar3,0);
            puVar9 = puVar9 + iVar4;
            EMIT_OP_REG_RPTR(ctx,op,xVar1,sDWORD,xVar2,2,xVar3,4);
            iVar4 = (*fun)(puVar9,xVar1,sDWORD,xVar2,2,xVar3,4);
            EMIT_OP_REG_RPTR(ctx,op,xVar1,sDWORD,xVar2,2,xVar3,0x400);
            iVar5 = (*fun)(puVar9 + iVar4,xVar1,sDWORD,xVar2,2,xVar3,0x400);
            puVar9 = puVar9 + iVar4 + iVar5;
          }
        }
        if ((testSize & 2) != 0 && ((int)lVar6 != 0 || (int)lVar7 != 0)) {
          xVar1 = testRegs[local_58];
          xVar2 = testIndexRegs[lVar7];
          xVar3 = *pxVar8;
          EMIT_OP_REG_RPTR(ctx,op,xVar1,sQWORD,xVar2,1,xVar3,0);
          iVar4 = (*fun)(puVar9,xVar1,sQWORD,xVar2,1,xVar3,0);
          puVar9 = puVar9 + iVar4;
          EMIT_OP_REG_RPTR(ctx,op,xVar1,sQWORD,xVar2,1,xVar3,4);
          iVar4 = (*fun)(puVar9,xVar1,sQWORD,xVar2,1,xVar3,4);
          EMIT_OP_REG_RPTR(ctx,op,xVar1,sQWORD,xVar2,1,xVar3,0x400);
          iVar5 = (*fun)(puVar9 + iVar4,xVar1,sQWORD,xVar2,1,xVar3,0x400);
          puVar9 = puVar9 + iVar4 + iVar5;
          if (lVar7 != 0) {
            EMIT_OP_REG_RPTR(ctx,op,xVar1,sQWORD,xVar2,2,xVar3,0);
            iVar4 = (*fun)(puVar9,xVar1,sQWORD,xVar2,2,xVar3,0);
            puVar9 = puVar9 + iVar4;
            EMIT_OP_REG_RPTR(ctx,op,xVar1,sQWORD,xVar2,2,xVar3,4);
            iVar4 = (*fun)(puVar9,xVar1,sQWORD,xVar2,2,xVar3,4);
            EMIT_OP_REG_RPTR(ctx,op,xVar1,sQWORD,xVar2,2,xVar3,0x400);
            iVar5 = (*fun)(puVar9 + iVar4,xVar1,sQWORD,xVar2,2,xVar3,0x400);
            puVar9 = puVar9 + iVar4 + iVar5;
          }
        }
        lVar6 = lVar6 + 1;
        pxVar8 = pxVar8 + 1;
      } while (lVar6 != 10);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 9);
    local_58 = local_58 + 1;
  } while (local_58 != 9);
  local_40 = (int)stream;
  return (int)puVar9 - local_40;
}

Assistant:

int TestRegRptrEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86Reg dst, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift), unsigned testSize = testSizeDword | testSizeQword)
{
	unsigned char *start = stream;

	for(unsigned reg = 0; reg < sizeof(testRegs) / sizeof(testRegs[0]); reg++)
	{
		for(unsigned index = 0; index < sizeof(testIndexRegs) / sizeof(testIndexRegs[0]); index++)
		{
			for(unsigned base = 0; base < sizeof(testBaseRegs) / sizeof(testBaseRegs[0]); base++)
			{
				if(testSize & testSizeDword)
				{
					if(testIndexRegs[index] != rNONE || testBaseRegs[base] != rNONE)
					{
						EMIT_OP_REG_RPTR(ctx, op, testRegs[reg], sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 0);
						stream += fun(stream, testRegs[reg], sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 0);
						EMIT_OP_REG_RPTR(ctx, op, testRegs[reg], sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 4);
						stream += fun(stream, testRegs[reg], sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 4);
						EMIT_OP_REG_RPTR(ctx, op, testRegs[reg], sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024);
						stream += fun(stream, testRegs[reg], sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024);
					}

					if(testIndexRegs[index] != rNONE)
					{
						EMIT_OP_REG_RPTR(ctx, op, testRegs[reg], sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 0);
						stream += fun(stream, testRegs[reg], sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 0);
						EMIT_OP_REG_RPTR(ctx, op, testRegs[reg], sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 4);
						stream += fun(stream, testRegs[reg], sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 4);
						EMIT_OP_REG_RPTR(ctx, op, testRegs[reg], sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024);
						stream += fun(stream, testRegs[reg], sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024);
					}
				}

				if(testSize & testSizeQword)
				{
					// skip RDI-based addressing
					if(testIndexRegs[index] != rNONE || testBaseRegs[base] != rNONE)
					{
						EMIT_OP_REG_RPTR(ctx, op, testRegs[reg], sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 0);
						stream += fun(stream, testRegs[reg], sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 0);
						EMIT_OP_REG_RPTR(ctx, op, testRegs[reg], sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 4);
						stream += fun(stream, testRegs[reg], sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 4);
						EMIT_OP_REG_RPTR(ctx, op, testRegs[reg], sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024);
						stream += fun(stream, testRegs[reg], sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024);
					}

					if(testIndexRegs[index] != rNONE)
					{
						EMIT_OP_REG_RPTR(ctx, op, testRegs[reg], sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 0);
						stream += fun(stream, testRegs[reg], sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 0);
						EMIT_OP_REG_RPTR(ctx, op, testRegs[reg], sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 4);
						stream += fun(stream, testRegs[reg], sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 4);
						EMIT_OP_REG_RPTR(ctx, op, testRegs[reg], sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024);
						stream += fun(stream, testRegs[reg], sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024);
					}
				}
			}
		}
	}

	return int(stream - start);
}